

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_slliq(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ts_00;
  uint uVar1;
  TCGv_i64 ret;
  
  s = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0xb & 0x1f;
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)ts - (long)s);
  ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_rotli_i64_ppc64
            (s,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),uVar1);
  tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_00,(TCGArg)(s->cpu_env + (long)s),0xb18);
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),0xb18);
  uVar1 = -1 << (sbyte)uVar1;
  tcg_gen_andi_i64_ppc64(s,ret,ret,(ulong)uVar1);
  tcg_gen_andi_i64_ppc64
            (s,(TCGv_i64)((long)ts_00 - (long)s),(TCGv_i64)((long)ts_00 - (long)s),(ulong)~uVar1);
  tcg_gen_op3_ppc64(s,INDEX_op_or_i64,
                    (TCGArg)((long)&s->pool_cur +
                            (long)cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]),(TCGArg)ts,
                    (TCGArg)ts_00);
  tcg_temp_free_internal_ppc64(s,ts);
  tcg_temp_free_internal_ppc64(s,ts_00);
  if ((ctx->opcode & 1) != 0) {
    gen_slliq_cold_1();
  }
  return;
}

Assistant:

static void gen_slliq(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int sh = SH(ctx->opcode);
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    tcg_gen_rotli_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)], sh);
    gen_load_spr(tcg_ctx, t1, SPR_MQ);
    gen_store_spr(tcg_ctx, SPR_MQ, t0);
    tcg_gen_andi_tl(tcg_ctx, t0, t0,  (0xFFFFFFFFU << sh));
    tcg_gen_andi_tl(tcg_ctx, t1, t1, ~(0xFFFFFFFFU << sh));
    tcg_gen_or_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t0, t1);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}